

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::Postprocess_BuildShape
          (X3DImporter *this,CX3DImporter_NodeElement_Shape *pShapeNodeElement,
          list<unsigned_int,_std::allocator<unsigned_int>_> *pNodeMeshInd,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pSceneMeshList,
          list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pSceneMaterialList)

{
  size_t *psVar1;
  EType pType;
  CX3DImporter_NodeElement *pNodeElement;
  int iVar2;
  size_t sVar3;
  list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *plVar4;
  bool bVar5;
  uint uVar6;
  _List_node_base *p_Var7;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar8;
  _List_node_base *p_Var9;
  int32_t tm;
  aiMesh *tmesh;
  aiMaterial *tmat;
  undefined4 local_64;
  aiMesh *local_60;
  aiMaterial *local_58;
  ulong local_50;
  ulong local_48;
  list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *local_40;
  X3DImporter *local_38;
  
  local_58 = (aiMaterial *)0x0;
  local_60 = (aiMesh *)0x0;
  p_Var9 = (pShapeNodeElement->super_CX3DImporter_NodeElement).Child.
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  plVar8 = &(pShapeNodeElement->super_CX3DImporter_NodeElement).Child;
  local_40 = pSceneMaterialList;
  local_38 = this;
  if (p_Var9 == (_List_node_base *)plVar8) {
    local_50 = 0;
    local_48 = 0x2c;
  }
  else {
    local_48 = 0x2c;
    local_50 = 0;
    do {
      pNodeElement = (CX3DImporter_NodeElement *)p_Var9[1]._M_next;
      pType = pNodeElement->Type;
      bVar5 = PostprocessHelper_ElementIsMesh(this,pType);
      if (bVar5) {
        this = local_38;
        Postprocess_BuildMesh(local_38,pNodeElement,&local_60);
        if (local_60 != (aiMesh *)0x0) {
          sVar3 = (pSceneMeshList->super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                  _M_node._M_size;
          p_Var7 = (_List_node_base *)operator_new(0x18);
          *(int *)&p_Var7[1]._M_next = (int)sVar3;
          std::__detail::_List_node_base::_M_hook(p_Var7);
          psVar1 = &(pNodeMeshInd->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          this = (X3DImporter *)operator_new(0x18);
          *(aiMesh **)
           &(this->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header =
               local_60;
          std::__detail::_List_node_base::_M_hook((_List_node_base *)this);
          psVar1 = &(pSceneMeshList->super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          local_48 = (ulong)*(uint *)&(p_Var9[1]._M_next)->_M_prev;
        }
      }
      else if ((pType == ENET_Appearance) &&
              (Postprocess_BuildMaterial(this,pNodeElement,&local_58), plVar4 = local_40,
              local_58 != (aiMaterial *)0x0)) {
        local_50 = (ulong)(uint)(local_40->
                                super__List_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                _M_impl._M_node._M_size;
        this = (X3DImporter *)operator_new(0x18);
        *(aiMaterial **)
         &(this->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header =
             local_58;
        std::__detail::_List_node_base::_M_hook((_List_node_base *)this);
        psVar1 = &(plVar4->super__List_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != (_List_node_base *)plVar8);
  }
  if (local_60 != (aiMesh *)0x0 && local_58 != (aiMaterial *)0x0) {
    local_60->mMaterialIndex = (uint)local_50;
    uVar6 = aiGetMaterialTextureCount(local_58,aiTextureType_DIFFUSE);
    if ((uVar6 != 0) &&
       ((local_60->mTextureCoords[0] == (aiVector3D *)0x0 || (local_60->mNumVertices == 0)))) {
      iVar2 = (int)local_48;
      if (iVar2 - 0x10U < 2) {
        local_64 = 2;
      }
      else if (iVar2 == 0x12) {
        local_64 = 1;
      }
      else if (iVar2 == 0xf) {
        local_64 = 3;
      }
      else {
        local_64 = 4;
      }
      aiMaterial::AddBinaryProperty(local_58,&local_64,4,"$tex.mapping",1,0,aiPTI_Integer);
    }
  }
  return;
}

Assistant:

void X3DImporter::Postprocess_BuildShape(const CX3DImporter_NodeElement_Shape& pShapeNodeElement, std::list<unsigned int>& pNodeMeshInd,
							std::list<aiMesh*>& pSceneMeshList, std::list<aiMaterial*>& pSceneMaterialList) const
{
    aiMaterial* tmat = nullptr;
    aiMesh* tmesh = nullptr;
    CX3DImporter_NodeElement::EType mesh_type = CX3DImporter_NodeElement::ENET_Invalid;
    unsigned int mat_ind = 0;

	for(std::list<CX3DImporter_NodeElement*>::const_iterator it = pShapeNodeElement.Child.begin(); it != pShapeNodeElement.Child.end(); ++it)
	{
		if(PostprocessHelper_ElementIsMesh((*it)->Type))
		{
			Postprocess_BuildMesh(**it, &tmesh);
			if(tmesh != nullptr)
			{
				// if mesh successfully built then add data about it to arrays
				pNodeMeshInd.push_back(static_cast<unsigned int>(pSceneMeshList.size()));
				pSceneMeshList.push_back(tmesh);
				// keep mesh type. Need above for texture coordinate generation.
				mesh_type = (*it)->Type;
			}
		}
		else if((*it)->Type == CX3DImporter_NodeElement::ENET_Appearance)
		{
			Postprocess_BuildMaterial(**it, &tmat);
			if(tmat != nullptr)
			{
				// if material successfully built then add data about it to array
				mat_ind = static_cast<unsigned int>(pSceneMaterialList.size());
				pSceneMaterialList.push_back(tmat);
			}
		}
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator it = pShapeNodeElement.Child.begin(); it != pShapeNodeElement.Child.end(); it++)

	// associate read material with read mesh.
	if((tmesh != nullptr) && (tmat != nullptr))
	{
		tmesh->mMaterialIndex = mat_ind;
		// Check texture mapping. If material has texture but mesh has no texture coordinate then try to ask Assimp to generate texture coordinates.
		if((tmat->GetTextureCount(aiTextureType_DIFFUSE) != 0) && !tmesh->HasTextureCoords(0))
		{
			int32_t tm;
			aiVector3D tvec3;

			switch(mesh_type)
			{
				case CX3DImporter_NodeElement::ENET_Box:
					tm = aiTextureMapping_BOX;
					break;
				case CX3DImporter_NodeElement::ENET_Cone:
				case CX3DImporter_NodeElement::ENET_Cylinder:
					tm = aiTextureMapping_CYLINDER;
					break;
				case CX3DImporter_NodeElement::ENET_Sphere:
					tm = aiTextureMapping_SPHERE;
					break;
				default:
					tm = aiTextureMapping_PLANE;
					break;
			}// switch(mesh_type)

			tmat->AddProperty(&tm, 1, AI_MATKEY_MAPPING_DIFFUSE(0));
		}// if((tmat->GetTextureCount(aiTextureType_DIFFUSE) != 0) && !tmesh->HasTextureCoords(0))
	}// if((tmesh != nullptr) && (tmat != nullptr))
}